

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O0

bpf_u_int32 if_flags_to_pcap_flags(char *name,u_int if_flags)

{
  uint local_18;
  bpf_u_int32 pcap_flags;
  u_int if_flags_local;
  char *name_local;
  
  local_18 = (uint)((if_flags & 8) != 0);
  if ((if_flags & 1) != 0) {
    local_18 = local_18 | 2;
  }
  if ((if_flags & 0x40) != 0) {
    local_18 = local_18 | 4;
  }
  return local_18;
}

Assistant:

bpf_u_int32
if_flags_to_pcap_flags(const char *name _U_, u_int if_flags)
{
	bpf_u_int32 pcap_flags;

	pcap_flags = 0;
	if (ISLOOPBACK(name, if_flags))
		pcap_flags |= PCAP_IF_LOOPBACK;
	if (ISUP(if_flags))
		pcap_flags |= PCAP_IF_UP;
	if (ISRUNNING(if_flags))
		pcap_flags |= PCAP_IF_RUNNING;
	return (pcap_flags);
}